

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O0

ELzmaDummy crnlib::LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,SizeT inSize)

{
  UInt16 *pUVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Byte *pBVar5;
  uint local_dc;
  SizeT local_d0;
  SizeT local_b8;
  uint local_9c;
  int local_98;
  uint i;
  int numDirectBits;
  uint posSlot;
  UInt16 *probLen;
  uint local_80;
  uint offset;
  uint limit;
  uint len;
  UInt16 *probLit;
  uint bit;
  uint symbol_1;
  uint offs;
  uint matchByte;
  uint symbol;
  uint posState;
  uint ttt;
  UInt32 bound;
  UInt16 *prob;
  ELzmaDummy res;
  uint state;
  UInt16 *probs;
  Byte *bufLimit;
  UInt32 code;
  UInt32 range;
  SizeT inSize_local;
  Byte *buf_local;
  CLzmaDec *p_local;
  
  bufLimit._4_4_ = p->range;
  bufLimit._0_4_ = p->code;
  pBVar5 = buf + inSize;
  pUVar1 = p->probs;
  uVar4 = p->state;
  uVar2 = p->processedPos & (1 << ((byte)(p->prop).pb & 0x1f)) - 1U;
  inSize_local = (SizeT)buf;
  if (bufLimit._4_4_ < 0x1000000) {
    if (pBVar5 <= buf) {
      return DUMMY_ERROR;
    }
    bufLimit._4_4_ = bufLimit._4_4_ << 8;
    inSize_local = (SizeT)(buf + 1);
    bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*buf;
  }
  uVar3 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)(uVar4 << 4) + (ulong)uVar2];
  if ((UInt32)bufLimit < uVar3) {
    _ttt = pUVar1 + 0x736;
    if ((p->checkDicSize != 0) || (p->processedPos != 0)) {
      if (p->dicPos == 0) {
        local_b8 = p->dicBufSize;
      }
      else {
        local_b8 = p->dicPos;
      }
      _ttt = _ttt + (((p->processedPos & (1 << ((byte)(p->prop).lp & 0x1f)) - 1U) <<
                     ((byte)(p->prop).lc & 0x1f)) +
                    ((int)(uint)p->dic[local_b8 - 1] >> (8U - (char)(p->prop).lc & 0x1f))) * 0x300;
    }
    bufLimit._4_4_ = uVar3;
    if (uVar4 < 7) {
      offs = 1;
      do {
        if (bufLimit._4_4_ < 0x1000000) {
          if (pBVar5 <= inSize_local) {
            return DUMMY_ERROR;
          }
          bufLimit._4_4_ = bufLimit._4_4_ << 8;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
          inSize_local = inSize_local + 1;
        }
        uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[offs];
        if ((UInt32)bufLimit < uVar4) {
          offs = offs * 2;
          bufLimit._4_4_ = uVar4;
        }
        else {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
          offs = offs * 2 + 1;
        }
      } while (offs < 0x100);
    }
    else {
      if (p->dicPos < (ulong)p->reps[0]) {
        local_d0 = p->dicBufSize;
      }
      else {
        local_d0 = 0;
      }
      symbol_1 = (uint)p->dic[(p->dicPos - (ulong)p->reps[0]) + local_d0];
      bit = 0x100;
      probLit._4_4_ = 1;
      do {
        symbol_1 = symbol_1 << 1;
        uVar4 = symbol_1 & bit;
        if (bufLimit._4_4_ < 0x1000000) {
          if (pBVar5 <= inSize_local) {
            return DUMMY_ERROR;
          }
          bufLimit._4_4_ = bufLimit._4_4_ << 8;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
          inSize_local = inSize_local + 1;
        }
        uVar2 = (bufLimit._4_4_ >> 0xb) *
                (uint)_ttt[(ulong)bit + (ulong)uVar4 + (ulong)probLit._4_4_];
        if ((UInt32)bufLimit < uVar2) {
          probLit._4_4_ = probLit._4_4_ * 2;
          uVar4 = uVar4 ^ 0xffffffff;
          bufLimit._4_4_ = uVar2;
        }
        else {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar2;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar2;
          probLit._4_4_ = probLit._4_4_ * 2 + 1;
        }
        bit = uVar4 & bit;
      } while (probLit._4_4_ < 0x100);
    }
    prob._0_4_ = DUMMY_LIT;
  }
  else {
    bufLimit._4_4_ = bufLimit._4_4_ - uVar3;
    bufLimit._0_4_ = (UInt32)bufLimit - uVar3;
    if (bufLimit._4_4_ < 0x1000000) {
      if (pBVar5 <= inSize_local) {
        return DUMMY_ERROR;
      }
      bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
      bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)inSize_local;
      inSize_local = inSize_local + 1;
    }
    uVar3 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)uVar4 + 0xc0];
    if ((UInt32)bufLimit < uVar3) {
      prob._4_4_ = 0;
      _ttt = pUVar1 + 0x332;
      prob._0_4_ = DUMMY_MATCH;
      bufLimit._4_4_ = uVar3;
    }
    else {
      bufLimit._4_4_ = bufLimit._4_4_ - uVar3;
      bufLimit._0_4_ = (UInt32)bufLimit - uVar3;
      prob._0_4_ = DUMMY_REP;
      if (bufLimit._4_4_ < 0x1000000) {
        if (pBVar5 <= inSize_local) {
          return DUMMY_ERROR;
        }
        bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
        bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)inSize_local;
        inSize_local = inSize_local + 1;
      }
      uVar3 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)uVar4 + 0xcc];
      if ((UInt32)bufLimit < uVar3) {
        bufLimit._4_4_ = uVar3;
        if (uVar3 < 0x1000000) {
          if (pBVar5 <= inSize_local) {
            return DUMMY_ERROR;
          }
          bufLimit._4_4_ = uVar3 * 0x100;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
          inSize_local = inSize_local + 1;
        }
        uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)(uVar4 << 4) + (ulong)uVar2 + 0xf0];
        if ((UInt32)bufLimit < uVar4) {
          if ((uVar4 < 0x1000000) && (pBVar5 <= inSize_local)) {
            return DUMMY_ERROR;
          }
          return DUMMY_REP;
        }
        bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
        uVar3 = bufLimit._4_4_ - uVar4;
      }
      else {
        bufLimit._4_4_ = bufLimit._4_4_ - uVar3;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar3;
        if (bufLimit._4_4_ < 0x1000000) {
          if (pBVar5 <= inSize_local) {
            return DUMMY_ERROR;
          }
          bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
          bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)inSize_local;
          inSize_local = inSize_local + 1;
        }
        uVar3 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)uVar4 + 0xd8];
        if (uVar3 <= (UInt32)bufLimit) {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar3;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar3;
          if (bufLimit._4_4_ < 0x1000000) {
            if (pBVar5 <= inSize_local) {
              return DUMMY_ERROR;
            }
            bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
            bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)inSize_local;
            inSize_local = inSize_local + 1;
          }
          uVar3 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)uVar4 + 0xe4];
          if (uVar3 <= (UInt32)bufLimit) {
            bufLimit._0_4_ = (UInt32)bufLimit - uVar3;
            uVar3 = bufLimit._4_4_ - uVar3;
          }
        }
      }
      bufLimit._4_4_ = uVar3;
      prob._4_4_ = 0xc;
      _ttt = pUVar1 + 0x534;
    }
    if (bufLimit._4_4_ < 0x1000000) {
      if (pBVar5 <= inSize_local) {
        return DUMMY_ERROR;
      }
      bufLimit._4_4_ = bufLimit._4_4_ << 8;
      bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
      inSize_local = inSize_local + 1;
    }
    uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)*_ttt;
    if ((UInt32)bufLimit < uVar4) {
      _numDirectBits = _ttt + (ulong)(uVar2 << 3) + 2;
      probLen._4_4_ = 0;
      local_80 = 8;
      bufLimit._4_4_ = uVar4;
    }
    else {
      bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
      bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
      if (bufLimit._4_4_ < 0x1000000) {
        if (pBVar5 <= inSize_local) {
          return DUMMY_ERROR;
        }
        bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
        bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)inSize_local;
        inSize_local = inSize_local + 1;
      }
      uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[1];
      if ((UInt32)bufLimit < uVar4) {
        _numDirectBits = _ttt + (ulong)(uVar2 << 3) + 0x82;
        probLen._4_4_ = 8;
        local_80 = 8;
        bufLimit._4_4_ = uVar4;
      }
      else {
        bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
        _numDirectBits = _ttt + 0x102;
        probLen._4_4_ = 0x10;
        local_80 = 0x100;
      }
    }
    offset = 1;
    do {
      if (bufLimit._4_4_ < 0x1000000) {
        if (pBVar5 <= inSize_local) {
          return DUMMY_ERROR;
        }
        bufLimit._4_4_ = bufLimit._4_4_ << 8;
        bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
        inSize_local = inSize_local + 1;
      }
      uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)_numDirectBits[offset];
      if ((UInt32)bufLimit < uVar4) {
        offset = offset * 2;
        bufLimit._4_4_ = uVar4;
      }
      else {
        bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
        offset = offset * 2 + 1;
      }
    } while (offset < local_80);
    local_dc = probLen._4_4_ + (offset - local_80);
    if (prob._4_4_ < 4) {
      if (3 < local_dc) {
        local_dc = 3;
      }
      i = 1;
      do {
        if (bufLimit._4_4_ < 0x1000000) {
          if (pBVar5 <= inSize_local) {
            return DUMMY_ERROR;
          }
          bufLimit._4_4_ = bufLimit._4_4_ << 8;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
          inSize_local = inSize_local + 1;
        }
        uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)pUVar1[(ulong)(local_dc << 6) + (ulong)i + 0x1b0];
        if ((UInt32)bufLimit < uVar4) {
          i = i * 2;
          bufLimit._4_4_ = uVar4;
        }
        else {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
          i = i * 2 + 1;
        }
      } while (i < 0x40);
      uVar4 = i - 0x40;
      if (3 < uVar4) {
        local_98 = (uVar4 >> 1) - 1;
        if (uVar4 < 0xe) {
          _ttt = pUVar1 + (ulong)((uVar4 & 1 | 2) << ((byte)local_98 & 0x1f)) +
                          (0x2af - (ulong)uVar4);
        }
        else {
          local_98 = (uVar4 >> 1) - 5;
          do {
            if (bufLimit._4_4_ < 0x1000000) {
              if (pBVar5 <= inSize_local) {
                return DUMMY_ERROR;
              }
              bufLimit._4_4_ = bufLimit._4_4_ << 8;
              bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
              inSize_local = inSize_local + 1;
            }
            bufLimit._4_4_ = bufLimit._4_4_ >> 1;
            bufLimit._0_4_ =
                 (UInt32)bufLimit -
                 (bufLimit._4_4_ & 0xffffffffU - ((int)((UInt32)bufLimit - bufLimit._4_4_) >> 0x1f))
            ;
            local_98 = local_98 + -1;
          } while (local_98 != 0);
          _ttt = pUVar1 + 0x322;
          local_98 = 4;
        }
        local_9c = 1;
        do {
          if (bufLimit._4_4_ < 0x1000000) {
            if (pBVar5 <= inSize_local) {
              return DUMMY_ERROR;
            }
            bufLimit._4_4_ = bufLimit._4_4_ << 8;
            bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)inSize_local;
            inSize_local = inSize_local + 1;
          }
          uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[local_9c];
          if ((UInt32)bufLimit < uVar4) {
            local_9c = local_9c * 2;
            bufLimit._4_4_ = uVar4;
          }
          else {
            bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
            bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
            local_9c = local_9c * 2 + 1;
          }
          local_98 = local_98 + -1;
        } while (local_98 != 0);
      }
    }
  }
  if ((bufLimit._4_4_ < 0x1000000) && (pBVar5 <= inSize_local)) {
    p_local._4_4_ = DUMMY_ERROR;
  }
  else {
    p_local._4_4_ = (ELzmaDummy)prob;
  }
  return p_local._4_4_;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec* p, const Byte* buf, SizeT inSize) {
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte* bufLimit = buf + inSize;
  CLzmaProb* probs = p->probs;
  unsigned state = p->state;
  ELzmaDummy res;

  {
    CLzmaProb* prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = (p->processedPos) & ((1 << p->prop.pb) - 1);

    prob = probs + IsMatch + (state << kNumPosBitsMax) + posState;
    IF_BIT_0_CHECK(prob) {
      UPDATE_0_CHECK

      /* if (bufLimit - buf >= 7) return DUMMY_LIT; */

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += (LZMA_LIT_SIZE *
                 ((((p->processedPos) & ((1 << (p->prop.lp)) - 1)) << p->prop.lc) +
                  (p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates) {
        unsigned symbol = 1;
        do {
          GET_BIT_CHECK(prob + symbol, symbol)
        } while (symbol < 0x100);
      } else {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
                                    ((p->dicPos < p->reps[0]) ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do {
          unsigned bit;
          CLzmaProb* probLit;
          matchByte <<= 1;
          bit = (matchByte & offs);
          probLit = prob + offs + bit + symbol;
          GET_BIT2_CHECK(probLit, symbol, offs &= ~bit, offs &= bit)
        } while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else {
      unsigned len;
      UPDATE_1_CHECK;

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob) {
        UPDATE_0_CHECK;
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else {
        UPDATE_1_CHECK;
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob) {
          UPDATE_0_CHECK;
          prob = probs + IsRep0Long + (state << kNumPosBitsMax) + posState;
          IF_BIT_0_CHECK(prob) {
            UPDATE_0_CHECK;
            NORMALIZE_CHECK;
            return DUMMY_REP;
          }
          else {
            UPDATE_1_CHECK;
          }
        }
        else {
          UPDATE_1_CHECK;
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob) {
            UPDATE_0_CHECK;
          }
          else {
            UPDATE_1_CHECK;
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob) {
              UPDATE_0_CHECK;
            }
            else {
              UPDATE_1_CHECK;
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }
      {
        unsigned limit, offset;
        CLzmaProb* probLen = prob + LenChoice;
        IF_BIT_0_CHECK(probLen) {
          UPDATE_0_CHECK;
          probLen = prob + LenLow + (posState << kLenNumLowBits);
          offset = 0;
          limit = 1 << kLenNumLowBits;
        }
        else {
          UPDATE_1_CHECK;
          probLen = prob + LenChoice2;
          IF_BIT_0_CHECK(probLen) {
            UPDATE_0_CHECK;
            probLen = prob + LenMid + (posState << kLenNumMidBits);
            offset = kLenNumLowSymbols;
            limit = 1 << kLenNumMidBits;
          }
          else {
            UPDATE_1_CHECK;
            probLen = prob + LenHigh;
            offset = kLenNumLowSymbols + kLenNumMidSymbols;
            limit = 1 << kLenNumHighBits;
          }
        }